

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcexecutors.cpp
# Opt level: O0

void * testfunc_thread_starter(void *arg)

{
  int iVar1;
  shared_ptr<trun::TestModule> local_28;
  undefined8 *local_18;
  ThreadArg *threadArg;
  void *arg_local;
  
  local_18 = (undefined8 *)arg;
  threadArg = (ThreadArg *)arg;
  std::shared_ptr<trun::TestModule>::shared_ptr
            (&local_28,(shared_ptr<trun::TestModule> *)((long)arg + 8));
  trun::TestRunner::SetCurrentTestModule(&local_28);
  std::shared_ptr<trun::TestModule>::~shared_ptr(&local_28);
  trun::TestRunner::SetCurrentTestRunner((TestRunner *)local_18[3]);
  iVar1 = trun::TestFuncExecutorParallelPThread::ThreadFunc
                    ((TestFuncExecutorParallelPThread *)local_18[7],(TestFunc *)*local_18,
                     (CBPrePostHook *)local_18[4],(CBPrePostHook *)local_18[5]);
  *(int *)(local_18 + 6) = iVar1;
  return (void *)0x0;
}

Assistant:

static void *testfunc_thread_starter(void *arg) {
    auto threadArg = reinterpret_cast<ThreadArg *>(arg);

    TestRunner::SetCurrentTestModule(threadArg->testModule);
    TestRunner::SetCurrentTestRunner(threadArg->testRunner);

    threadArg->returnValue = threadArg->executor->ThreadFunc(threadArg->testFunc, threadArg->cbPreHook, threadArg->cbPostHook);
    // Return NULL here as this is a C callback..
    return NULL;
}